

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IImage.h
# Opt level: O1

void __thiscall irr::video::IImage::setMipMapsData(IImage *this,void *data,bool ownForeignMemory)

{
  u32 uVar1;
  u8 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  puVar2 = this->MipMapsData;
  if (puVar2 != (u8 *)data) {
    if (this->DeleteMipMapsMemory == true) {
      if (puVar2 != (u8 *)0x0) {
        operator_delete__(puVar2);
      }
      this->DeleteMipMapsMemory = false;
    }
    if (data == (void *)0x0) {
      this->MipMapsData = (u8 *)0x0;
    }
    else if (ownForeignMemory) {
      this->MipMapsData = (u8 *)data;
      this->DeleteMipMapsMemory = false;
    }
    else {
      uVar3 = (this->Size).Width;
      uVar4 = (this->Size).Height;
      uVar5 = 0;
      do {
        uVar3 = uVar3 >> (1 < uVar3);
        uVar4 = uVar4 >> (1 < uVar4);
        uVar1 = getBitsPerPixelFromFormat(this->Format);
        uVar5 = uVar5 + uVar4 * uVar3 * (uVar1 >> 3);
      } while (uVar4 != 1 || uVar3 != 1);
      puVar2 = (u8 *)operator_new__((ulong)uVar5);
      this->MipMapsData = puVar2;
      memcpy(puVar2,data,(ulong)uVar5);
      this->DeleteMipMapsMemory = true;
    }
  }
  return;
}

Assistant:

void setMipMapsData(void *data, bool ownForeignMemory)
	{
		if (data != MipMapsData) {
			if (DeleteMipMapsMemory) {
				delete[] MipMapsData;

				DeleteMipMapsMemory = false;
			}

			if (data) {
				if (ownForeignMemory) {
					MipMapsData = static_cast<u8 *>(data);

					DeleteMipMapsMemory = false;
				} else {
					u32 dataSize = 0;
					u32 width = Size.Width;
					u32 height = Size.Height;

					do {
						if (width > 1)
							width >>= 1;

						if (height > 1)
							height >>= 1;

						dataSize += getDataSizeFromFormat(Format, width, height);
					} while (width != 1 || height != 1);

					MipMapsData = new u8[dataSize];
					memcpy(MipMapsData, data, dataSize);

					DeleteMipMapsMemory = true;
				}
			} else {
				MipMapsData = 0;
			}
		}
	}